

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O3

void result_tests::ExpectSuccess<int,int>(Result<int> *result,bilingual_str *str,int *args)

{
  T *pTVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  T *local_140;
  T *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  lazy_ostream local_f0;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  T **local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined1 *local_98;
  T ***local_90;
  T **local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  T ***local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ExpectResult<int>(result,true,str);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x41;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(__index_type *)
         ((long)&(result->m_variant).super__Variant_base<bilingual_str,_int>.
                 super__Move_assign_alias<bilingual_str,_int>.
                 super__Copy_assign_alias<bilingual_str,_int>.
                 super__Move_ctor_alias<bilingual_str,_int>.
                 super__Copy_ctor_alias<bilingual_str,_int>.
                 super__Variant_storage_alias<bilingual_str,_int> + 0x40) == '\x01');
  local_88 = &local_138;
  local_138 = (T *)CONCAT71(local_138._1_7_,
                            local_50.p_predicate_value.super_readonly_property<bool>.
                            super_class_property<bool>.value);
  local_b0 = &local_140;
  local_140 = (T *)CONCAT71(local_140._1_7_,1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_58 = "";
  local_68 = &local_88;
  local_78 = 0;
  local_a0 = 0;
  local_80 = &PTR__lazy_ostream_01389268;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &PTR__lazy_ostream_01389268;
  local_90 = &local_b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xe9c9d9,(size_t)&local_60,0x41,&local_80,"true",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x42;
  file_00.m_begin = (iterator)&local_100;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
             msg_00);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_88 = (T **)util::Result<int>::value(result);
  local_138 = (T *)CONCAT44(local_138._4_4_,*args);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*(int *)local_88 == *args);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_58 = "";
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_138;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013890c8;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xe9ca0c,(size_t)&local_60,0x42,&local_80,
             "T{std::forward<Args>(args)...}",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x43;
  file_01.m_begin = (iterator)&local_120;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_130,
             msg_01);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  pTVar1 = util::Result<int>::value(result);
  local_138 = pTVar1;
  local_140 = util::Result<int>::value(result);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar1 == local_140);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/result_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_138;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_0138be48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_140;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_0138be48;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xe9ca0b,(size_t)&local_60,0x43,&local_80,"&*result",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ExpectSuccess(const util::Result<T>& result, const bilingual_str& str, Args&&... args)
{
    ExpectResult(result, true, str);
    BOOST_CHECK_EQUAL(result.has_value(), true);
    BOOST_CHECK_EQUAL(result.value(), T{std::forward<Args>(args)...});
    BOOST_CHECK_EQUAL(&result.value(), &*result);
}